

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_attn_no_cache::set_input(llm_graph_input_attn_no_cache *this,llama_ubatch *ubatch)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  llama_seq_id **pplVar7;
  int32_t *piVar8;
  llama_hparams *plVar9;
  uint uVar10;
  char cVar11;
  int s0_1;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int s0;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  int local_94;
  
  if (this->kq_mask != (ggml_tensor *)0x0) {
    bVar2 = this->cparams->causal_attn;
    uVar3 = ubatch->n_tokens;
    uVar14 = (ulong)uVar3;
    uVar4 = ubatch->n_seq_tokens;
    uVar22 = (ulong)uVar4;
    uVar15 = (ulong)ubatch->n_seqs;
    cVar11 = ggml_backend_buffer_is_host(this->kq_mask->buffer);
    if (bVar2 == true) {
      if (cVar11 == '\0') {
        uVar20 = 0x154;
LAB_001eb49d:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar20,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(kq_mask->buffer)");
      }
      pvVar6 = this->kq_mask->data;
      for (uVar19 = 0; uVar19 != uVar15; uVar19 = uVar19 + 1) {
        pplVar7 = ubatch->seq_id;
        iVar5 = *pplVar7[uVar19];
        for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
          piVar8 = ubatch->n_seq_id;
          lVar21 = (long)(int)((int)uVar19 * uVar4 + (int)uVar18);
          for (uVar17 = 0; uVar17 != uVar15; uVar17 = uVar17 + 1) {
            plVar9 = this->hparams;
            uVar3 = piVar8[uVar17];
            if (piVar8[uVar17] < 1) {
              uVar3 = 0;
            }
            for (uVar25 = 0; uVar25 != uVar22; uVar25 = uVar25 + 1) {
              lVar16 = (long)(int)((int)uVar17 * uVar4 + (int)uVar25);
              for (uVar24 = 0; uVar3 != uVar24; uVar24 = uVar24 + 1) {
                if ((pplVar7[uVar17][uVar24] == iVar5) &&
                   (iVar12 = ubatch->pos[lVar16], iVar13 = ubatch->pos[lVar21],
                   iVar23 = iVar12 - iVar13, iVar23 == 0 || iVar12 < iVar13)) {
                  fVar26 = 0.0;
                  if (plVar9->use_alibi == true) {
                    iVar12 = -iVar23;
                    if (iVar23 < 1) {
                      iVar12 = iVar23;
                    }
                    fVar26 = (float)iVar12;
                  }
                  goto LAB_001eb274;
                }
              }
              fVar26 = -INFINITY;
LAB_001eb274:
              *(float *)((long)pvVar6 + lVar16 * 4 + lVar21 * uVar14 * 4) = fVar26;
            }
          }
        }
      }
    }
    else {
      if (cVar11 == '\0') {
        uVar20 = 0x17a;
        goto LAB_001eb49d;
      }
      pvVar6 = this->kq_mask->data;
      local_94 = 0;
      for (uVar19 = 0; uVar19 != uVar15; uVar19 = uVar19 + 1) {
        pplVar7 = ubatch->seq_id;
        iVar5 = *pplVar7[uVar19];
        iVar12 = local_94;
        for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
          piVar8 = ubatch->n_seq_id;
          lVar21 = (long)(int)((int)uVar19 * uVar4 + (int)uVar18);
          for (uVar17 = 0; uVar25 = (long)(int)uVar3, uVar17 != uVar15; uVar17 = uVar17 + 1) {
            plVar9 = this->hparams;
            uVar10 = piVar8[uVar17];
            if (piVar8[uVar17] < 1) {
              uVar10 = 0;
            }
            for (uVar25 = 0; uVar25 != uVar22; uVar25 = uVar25 + 1) {
              uVar24 = 0;
              do {
                lVar16 = (long)(int)((int)uVar25 + (int)uVar17 * uVar4);
                if (uVar10 == uVar24) {
                  fVar26 = -INFINITY;
                  goto LAB_001eb400;
                }
                piVar1 = pplVar7[uVar17] + uVar24;
                uVar24 = uVar24 + 1;
              } while (*piVar1 != iVar5);
              fVar26 = 0.0;
              if (plVar9->use_alibi == true) {
                iVar23 = ubatch->pos[lVar16] - ubatch->pos[lVar21];
                iVar13 = -iVar23;
                if (iVar23 < 1) {
                  iVar13 = iVar23;
                }
                fVar26 = (float)iVar13;
              }
LAB_001eb400:
              *(float *)((long)pvVar6 + lVar16 * 4 + lVar21 * uVar14 * 4) = fVar26;
            }
          }
          for (; uVar14 != uVar25; uVar25 = uVar25 + 1) {
            *(undefined4 *)((long)pvVar6 + uVar25 * 4 + (long)iVar12 * uVar14 * 4) = 0xff800000;
          }
          iVar12 = iVar12 + 1;
        }
        local_94 = local_94 + uVar4;
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_no_cache::set_input(const llama_ubatch * ubatch) {
    if (kq_mask) {
        if (cparams.causal_attn) {
            const int64_t n_kv         = ubatch->n_tokens;
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));
            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id && ubatch->pos[ti] <= ubatch->pos[tj]) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_kv*n_tokens) + tj*n_kv + ti] = f;
                            }
                        }
                    }
                }
            }
        } else {
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;
            const int64_t n_stride     = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));

            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_tokens*n_tokens) + tj*n_stride + ti] = f;
                            }
                        }

                        for (int i = n_tokens; i < n_stride; ++i) {
                            data[h*(n_tokens*n_tokens) + tj*n_stride + i] = -INFINITY;
                        }
                    }
                }
            }
        }
    }
}